

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O3

void ruckig::Profile::check_step_for_position_extremum
               (double t_sum,double t,double p,double v,double a,double j,Bound *ext)

{
  double dVar1;
  
  if (p < ext->min) {
    ext->min = p;
    ext->t_min = t_sum;
  }
  if (ext->max <= p && p != ext->max) {
    ext->max = p;
    ext->t_max = t_sum;
  }
  if ((j == 0.0) && (!NAN(j))) {
    return;
  }
  dVar1 = a * a + j * -2.0 * v;
  if (2.220446049250313e-16 <= ABS(dVar1)) {
    if (dVar1 <= 0.0) {
      return;
    }
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    check_position_extremum((-a - dVar1) / j,t_sum,t,p,v,a,j,ext);
    dVar1 = dVar1 - a;
  }
  else {
    dVar1 = -a;
  }
  check_position_extremum(dVar1 / j,t_sum,t,p,v,a,j,ext);
  return;
}

Assistant:

static void check_step_for_position_extremum(double t_sum, double t, double p, double v, double a, double j, Bound& ext) {
        if (p < ext.min) {
            ext.min = p;
            ext.t_min = t_sum;
        }
        if (p > ext.max) {
            ext.max = p;
            ext.t_max = t_sum;
        }

        if (j != 0) {
            const double D = a * a - 2 * j * v;
            if (std::abs(D) < std::numeric_limits<double>::epsilon()) {
                check_position_extremum(-a / j, t_sum, t, p, v, a, j, ext);

            } else if (D > 0.0) {
                const double D_sqrt = std::sqrt(D);
                check_position_extremum((-a - D_sqrt) / j, t_sum, t, p, v, a, j, ext);
                check_position_extremum((-a + D_sqrt) / j, t_sum, t, p, v, a, j, ext);
            }
        }
    }